

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

bool __thiscall storage::BTree::_search_(BTree *this,int key,Record **out)

{
  BTNode *pBVar1;
  bool bVar2;
  int iVar3;
  BTInnerNode *this_00;
  BTLeafNode *this_01;
  BTNode *node;
  BTNode *local_40;
  int local_34;
  
  local_40 = this->root_;
  if (local_40 == (BTNode *)0x0) {
    bVar2 = false;
  }
  else {
    while( true ) {
      pBVar1 = local_40;
      iVar3 = (**local_40->_vptr_BTNode)(local_40);
      if ((char)iVar3 != '\0') break;
      this_00 = (BTInnerNode *)__dynamic_cast(pBVar1,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      BTInnerNode::search_node(this_00,key,&local_40);
    }
    this_01 = (BTLeafNode *)__dynamic_cast(pBVar1,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    bVar2 = BTLeafNode::search_record(this_01,key,out,&local_34);
  }
  return bVar2;
}

Assistant:

bool BTree::_search_(int key, Record *&out) {
        if (!root_)
            return false;
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        int index = -1;
        return dynamic_cast<BTLeafNode *>(node)->search_record(key, out, index);
    }